

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::WebSocketImpl::ZlibContext::reset(ZlibContext *this)

{
  bool bVar1;
  Fault local_90;
  Fault f_1;
  int local_80;
  DebugExpression<int> local_7c;
  undefined1 local_78 [8];
  DebugComparison<int,_int> _kjCondition_1;
  Fault local_48;
  Fault f;
  int local_38;
  DebugExpression<int> local_34;
  undefined1 local_30 [8];
  DebugComparison<int,_int> _kjCondition;
  ZlibContext *this_local;
  
  _kjCondition._24_8_ = this;
  if (this->mode == COMPRESS) {
    local_38 = deflateReset(&this->ctx);
    local_34 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_38);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int> *)local_30,&local_34,(int *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&,char_const(&)[23]>
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xd0a,FAILED,"deflateReset(&ctx) == Z_OK",
                 "_kjCondition,\"deflateReset() failed.\"",(DebugComparison<int,_int> *)local_30,
                 (char (*) [23])"deflateReset() failed.");
      kj::_::Debug::Fault::fatal(&local_48);
    }
  }
  else if (this->mode == DECOMPRESS) {
    local_80 = inflateReset(&this->ctx);
    local_7c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_80);
    f_1.exception._4_4_ = 0;
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int> *)local_78,&local_7c,(int *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_78);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&,char_const(&)[21]>
                (&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xd0e,FAILED,"inflateReset(&ctx) == Z_OK","_kjCondition,\"inflateReset failed.\"",
                 (DebugComparison<int,_int> *)local_78,(char (*) [21])"inflateReset failed.");
      kj::_::Debug::Fault::fatal(&local_90);
    }
  }
  return;
}

Assistant:

void reset() {
      // Resets the (de)compression context. This should only be called when the (de)compressor uses
      // client/server_no_context_takeover.
      switch (mode) {
        case Mode::COMPRESS: {
          KJ_ASSERT(deflateReset(&ctx) == Z_OK, "deflateReset() failed.");
          break;
        }
        case Mode::DECOMPRESS: {
          KJ_ASSERT(inflateReset(&ctx) == Z_OK, "inflateReset failed.");
          break;
        }
      }

    }